

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boolean.h
# Opt level: O2

string * __thiscall Boolean::asString_abi_cxx11_(string *__return_storage_ptr__,Boolean *this)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "false";
  if (this->value != false) {
    __s = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string asString() override {
        return value ? "true" : "false";
    }